

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_pow10.cpp
# Opt level: O2

void __thiscall sc_dt::scfx_pow10::scfx_pow10(scfx_pow10 *this)

{
  long lVar1;
  scfx_rep *psVar2;
  bool bVar3;
  scfx_rep sStack_48;
  
  lVar1 = 0;
  do {
    scfx_rep::scfx_rep((scfx_rep *)((long)&this->m_pos[0].m_mant.m_array + lVar1));
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x500);
  lVar1 = 0;
  psVar2 = this->m_neg;
  do {
    scfx_rep::scfx_rep(psVar2);
    lVar1 = lVar1 + -0x28;
    psVar2 = psVar2 + 1;
  } while (lVar1 != -0x500);
  scfx_rep::scfx_rep(&sStack_48,10.0);
  scfx_rep::operator=(this->m_pos,&sStack_48);
  scfx_mant::~scfx_mant(&sStack_48.m_mant);
  scfx_rep::scfx_rep(&sStack_48,0.1);
  scfx_rep::operator=(this->m_neg,&sStack_48);
  scfx_mant::~scfx_mant(&sStack_48.m_mant);
  psVar2 = this->m_neg;
  lVar1 = 0x1f;
  while (psVar2 = psVar2 + 1, bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    scfx_rep::set_nan(psVar2 + -0x20);
    scfx_rep::set_nan(psVar2);
  }
  return;
}

Assistant:

scfx_pow10::scfx_pow10()
{
    m_pos[0] = scfx_rep( 10.0 );
    m_neg[0] = scfx_rep( 0.1 );

    for( int i = 1; i < SCFX_POW10_TABLE_SIZE; i ++ )
    {
        m_pos[i].set_nan();
	m_neg[i].set_nan();
    }
}